

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O1

int wide_constant_instruction(char *name,Vm *vm,int offset)

{
  long lVar1;
  ushort uVar2;
  long lVar3;
  CrispyValue value;
  
  uVar2 = *(ushort *)
           (*(long *)(*(long *)(*(long *)(name + 0x1010) + (ulong)(*(int *)(name + 0x1018) - 1) * 8)
                     + 0x18) + 1 + (long)(int)vm);
  uVar2 = uVar2 << 8 | uVar2 >> 8;
  printf("%-16s %4d \'","OP_LDC_W",(ulong)uVar2);
  lVar1 = *(long *)(*(long *)(*(long *)(name + 0x1010) + (ulong)(*(int *)(name + 0x1018) - 1) * 8) +
                   0x48);
  lVar3 = (ulong)uVar2 * 0x10;
  value._4_4_ = 0;
  value.type = *(uint *)(lVar1 + lVar3);
  value.field_1.p_value =
       ((anon_union_8_3_4e733eb7_for_CrispyValue_1 *)(lVar1 + 8 + lVar3))->p_value;
  print_value(value,false,false);
  puts("\'");
  return (int)vm + 3;
}

Assistant:

static int wide_constant_instruction(const char *name, Vm *vm, int offset) {
    uint8_t *code = CURR_FRAME(vm)->code_buffer.code;
    uint16_t constant_index = (code[offset + 1] << 8) | code[offset + 2];

    printf("%-16s %4d '", name, constant_index);
    print_value(CURR_FRAME(vm)->constants.values[constant_index], false, false);
    printf("'\n");

    return offset + 3;
}